

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O2

void update_topten(int how,char *dumpname)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  unsigned_long uVar5;
  toptenentry *__ptr;
  ulong uVar6;
  uint uVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  toptenentry *__dest;
  long lVar12;
  int *piVar13;
  toptenentry newtt;
  char local_98 [104];
  
  if (program_state.panicking != 0) {
    return;
  }
  end_how = how;
  fill_topten_entry(&newtt,how);
  iVar2 = open_datafile("logfile",0x441,2);
  bVar1 = lock_fd(iVar2,10);
  if (bVar1 != '\0') {
    writeentry(iVar2,&newtt);
    unlock_fd(iVar2);
    close(iVar2);
  }
  iVar2 = open_datafile("xlogfile",0x441,2);
  bVar1 = lock_fd(iVar2,10);
  if (bVar1 != '\0') {
    __stream = fdopen(iVar2,"a");
    fprintf(__stream,
            "version=%d.%d.%d:points=%d:deathdnum=%d:deathlev=%d:maxlvl=%d:hp=%d:maxhp=%d:deaths=%d:deathdate=%lu:birthdate=%lu:uid=%d"
            ,(ulong)(uint)newtt.ver_major,(ulong)(uint)newtt.ver_minor,(ulong)(uint)newtt.patchlevel
            ,(ulong)(uint)newtt.points,(ulong)(uint)newtt.deathdnum,(ulong)(uint)newtt.deathlev,
            (ulong)(uint)newtt.maxlvl,(ulong)(uint)newtt.hp,(ulong)(uint)newtt.maxhp,
            (ulong)(uint)newtt.deaths,(long)newtt.deathdate,(long)newtt.birthdate,
            (ulong)(uint)newtt.uid);
    fprintf(__stream,":role=%s:race=%s:gender=%s:align=%s",newtt.plrole,newtt.plrace,newtt.plgend,
            newtt.plalign);
    pcVar4 = nh_getenv("DYNAMOHACKUSER");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = nh_getenv("USER");
    }
    pcVar8 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar8 = pcVar4;
    }
    munge_xlstring(local_98,pcVar8,100);
    fprintf(__stream,":name=%s",local_98);
    munge_xlstring(local_98,plname,100);
    fprintf(__stream,":charname=%s",local_98);
    munge_xlstring(local_98,newtt.death,100);
    fprintf(__stream,":death=%s",local_98);
    uVar5 = encode_conduct();
    fprintf(__stream,":conduct=%ld",uVar5);
    fprintf(__stream,":turns=%u",(ulong)moves);
    uVar7 = (uint)((ushort)u.uevent._0_2_ >> 2);
    uVar6 = (ulong)((uint)((u.uevent._0_2_ & 3) != 0) | uVar7 & 2);
    uVar11 = uVar6 + 4;
    if ((quest_status._0_4_ & 0x80040) == 0) {
      uVar11 = uVar6;
    }
    uVar11 = ((ushort)u.uevent._0_2_ >> 6 & 0x100 |
             uVar7 & 0x80 |
             (ushort)u.uevent._0_2_ >> 7 & 0x40 |
             (ushort)u.uevent._0_2_ >> 5 & 0x20 | (ushort)u.uevent._0_2_ >> 4 & 0x10 | uVar7 & 8) |
             uVar11;
    uVar6 = uVar11 | 0x200;
    if ((u.uevent._0_2_ & 0x1800) == 0) {
      uVar6 = uVar11;
    }
    uVar6 = (uint)quest_status._0_4_ >> 4 & 0x400 | uVar6;
    uVar11 = uVar6 | 0x800;
    if (mvitals[0x129].died == '\0') {
      uVar11 = uVar6;
    }
    uVar6 = uVar11 | 0x1000;
    if (mvitals[0x127].died == '\0') {
      uVar6 = uVar11;
    }
    uVar11 = uVar6 | 0x2000;
    if (mvitals[0xea].died == '\0') {
      uVar11 = uVar6;
    }
    uVar6 = uVar11 | 0x4000;
    if (mvitals[0x128].died == '\0') {
      uVar6 = uVar11;
    }
    uVar11 = uVar6 | 0x8000;
    if (mvitals[0x143].died == '\0') {
      uVar11 = uVar6;
    }
    fprintf(__stream,":event=%ld",uVar11);
    fprintf(__stream,":carried=%ld",(ulong)((byte)u.uhave._0_1_ & 0x1f));
    fprintf(__stream,":starttime=%lu:endtime=%lu",u.ubirthday,deathtime_internal);
    fprintf(__stream,":gender0=%s",genders[u.initgend].filecode);
    fprintf(__stream,":align0=%s",aligns[1 - (long)u.ualignbase[1]].filecode);
    fprintf(__stream,":xplevel=%d",(ulong)(uint)u.ulevel);
    fprintf(__stream,":exp=%d",(ulong)(uint)u.uexp);
    pcVar4 = "explore";
    if (flags.explore == '\0') {
      pcVar4 = "normal";
    }
    pcVar8 = "debug";
    if (flags.debug == '\0') {
      pcVar8 = pcVar4;
    }
    fprintf(__stream,":mode=%s",pcVar8);
    munge_xlstring(local_98,dumpname,100);
    fprintf(__stream,":dumplog=%s",dumpname);
    fputc(10,__stream);
    unlock_fd(iVar2);
    fclose(__stream);
  }
  if (flags.explore != '\0' || flags.debug != '\0') {
    return;
  }
  iVar2 = open_datafile("record",0x42,2);
  bVar1 = lock_fd(iVar2,0x1e);
  if (bVar1 == '\0') {
    close(iVar2);
    return;
  }
  __ptr = read_topten(iVar2,10000);
  pcVar4 = __ptr->name;
  uVar7 = 0;
  for (lVar10 = 0; lVar10 != 10000; lVar10 = lVar10 + 1) {
    if (((((toptenentry *)(pcVar4 + -0x4c))->points < 1) && (*(int *)(pcVar4 + -0x44) == 0)) ||
       (((toptenentry *)(pcVar4 + -0x4c))->points < newtt.points)) {
      if (uVar7 < 1000) {
        piVar13 = (int *)(pcVar4 + -0x44);
        lVar12 = lVar10;
        goto LAB_0024dde4;
      }
      break;
    }
    iVar3 = strncmp(newtt.name,pcVar4,0xf);
    uVar7 = uVar7 + (iVar3 == 0);
    pcVar4 = pcVar4 + 0xc0;
  }
  goto LAB_0024ddaf;
LAB_0024dde4:
  if (lVar12 == 10000) goto LAB_0024de22;
  if ((((toptenentry *)(piVar13 + -2))->points < 1) && (*piVar13 == 0)) goto LAB_0024de28;
  iVar3 = strncmp(newtt.name,pcVar4,0xf);
  if (iVar3 == 0) {
    if (0x3e6 < (int)uVar7) goto LAB_0024de28;
    uVar7 = uVar7 + 1;
  }
  lVar12 = lVar12 + 1;
  piVar13 = piVar13 + 0x30;
  goto LAB_0024dde4;
LAB_0024de22:
  lVar12 = 9999;
LAB_0024de28:
  __dest = __ptr + lVar12;
  for (lVar9 = (long)(int)lVar12; lVar10 < lVar9; lVar9 = lVar9 + -1) {
    memcpy(__dest,__dest + -1,0xc0);
    __dest = __dest + -1;
  }
  memcpy((toptenentry *)(pcVar4 + -0x4c),&newtt,0xc0);
  lseek(iVar2,0,0);
  ftruncate(iVar2,0);
  for (lVar10 = 0;
      (lVar10 != 0x1d4c00 &&
      ((0 < *(int *)(__ptr->plrole + lVar10 + -0x3c) ||
       (*(int *)(__ptr->plrole + lVar10 + -0x34) != 0)))); lVar10 = lVar10 + 0xc0) {
    writeentry(iVar2,(toptenentry *)(__ptr->plrole + lVar10 + -0x3c));
  }
LAB_0024ddaf:
  unlock_fd(iVar2);
  close(iVar2);
  free(__ptr);
  return;
}

Assistant:

void update_topten(int how, const char *dumpname)
{
    struct toptenentry *toptenlist, newtt;
    boolean need_rewrite;
    int  fd;

    if (program_state.panicking)
	return;

    end_how = how; /* save how for nh_get_topten */

    fill_topten_entry(&newtt, how);
    update_log(&newtt);
    update_xlog(&newtt, dumpname);

    /* nothing more to do for non-scoring games */
    if (wizard || discover)
	return;

    fd = open_datafile(RECORD, O_RDWR | O_CREAT, SCOREPREFIX);
    if (!lock_fd(fd, 30)) {
	close(fd);
	return;
    }

    toptenlist = read_topten(fd, TTLISTLEN);

    /* possibly rearrange the score list to include the new entry */
    need_rewrite = toptenlist_insert(toptenlist, &newtt);
    if (need_rewrite)
	write_topten(fd, toptenlist);

    unlock_fd(fd);
    close(fd);
    free(toptenlist);
}